

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

void Abc_TtCountOnesInCofs(word *pTruth,int nVars,int *pStore)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong x;
  int nWords;
  int Counter;
  int k;
  int i;
  word Temp;
  int *pStore_local;
  int nVars_local;
  word *pTruth_local;
  
  if (nVars < 7) {
    Abc_TtVerifySmallTruth(pTruth,nVars);
    for (Counter = 0; Counter < nVars; Counter = Counter + 1) {
      iVar1 = Abc_TtCountOnes(*pTruth & s_Truths6Neg[Counter]);
      pStore[Counter] = iVar1;
    }
  }
  else {
    if (nVars < 7) {
      __assert_fail("nVars > 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                    ,0x151,"void Abc_TtCountOnesInCofs(word *, int, int *)");
    }
    iVar1 = Abc_TtWordNum(nVars);
    memset(pStore,0,(long)nVars << 2);
    for (nWords = 0; nWords < iVar1; nWords = nWords + 2) {
      for (Counter = 0; Counter < 6; Counter = Counter + 1) {
        x = pTruth[nWords] & s_Truths6Neg[Counter] |
            (pTruth[nWords + 1] & s_Truths6Neg[Counter]) <<
            ((byte)(1 << ((byte)Counter & 0x1f)) & 0x3f);
        if (x != 0) {
          iVar2 = Abc_TtCountOnes(x);
          pStore[Counter] = iVar2 + pStore[Counter];
        }
      }
      if (pTruth[nWords] != 0) {
        iVar2 = Abc_TtCountOnes(pTruth[nWords]);
        for (Counter = 6; Counter < nVars; Counter = Counter + 1) {
          if ((nWords & 1 << ((char)Counter - 6U & 0x1f)) == 0) {
            pStore[Counter] = iVar2 + pStore[Counter];
          }
        }
      }
      uVar3 = nWords + 1;
      if (pTruth[(int)uVar3] != 0) {
        iVar2 = Abc_TtCountOnes(pTruth[(int)uVar3]);
        for (Counter = 6; Counter < nVars; Counter = Counter + 1) {
          if ((uVar3 & 1 << ((char)Counter - 6U & 0x1f)) == 0) {
            pStore[Counter] = iVar2 + pStore[Counter];
          }
        }
      }
    }
  }
  return;
}

Assistant:

static inline void Abc_TtCountOnesInCofs( word * pTruth, int nVars, int * pStore )
{
    word Temp;
    int i, k, Counter, nWords;
    if ( nVars <= 6 )
    {
        Abc_TtVerifySmallTruth(pTruth, nVars);
        for ( i = 0; i < nVars; i++ )
            pStore[i] = Abc_TtCountOnes( pTruth[0] & s_Truths6Neg[i] );
        return;
    }
    assert( nVars > 6 );
    nWords = Abc_TtWordNum( nVars );
    memset( pStore, 0, sizeof(int) * nVars );
    for ( k = 0; k < nWords; k++ )
    {
        // count 1's for the first six variables
        for ( i = 0; i < 6; i++ )
            if ( (Temp = (pTruth[k] & s_Truths6Neg[i]) | ((pTruth[k+1] & s_Truths6Neg[i]) << (1 << i))) )
                pStore[i] += Abc_TtCountOnes( Temp );
        // count 1's for all other variables
        if ( pTruth[k] )
        {
            Counter = Abc_TtCountOnes( pTruth[k] );
            for ( i = 6; i < nVars; i++ )
                if ( (k & (1 << (i-6))) == 0 )
                    pStore[i] += Counter;
        }
        k++;
        // count 1's for all other variables
        if ( pTruth[k] )
        {
            Counter = Abc_TtCountOnes( pTruth[k] );
            for ( i = 6; i < nVars; i++ )
                if ( (k & (1 << (i-6))) == 0 )
                    pStore[i] += Counter;
        }
    } 
}